

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

uint __thiscall
llvm::detail::DoubleAPFloat::convertToHexString
          (DoubleAPFloat *this,char *DST,uint HexDigits,bool UpperCase,roundingMode RM)

{
  uint uVar1;
  DoubleAPFloat local_58;
  APFloat local_48;
  roundingMode local_24;
  byte local_1d;
  roundingMode RM_local;
  bool UpperCase_local;
  char *pcStack_18;
  uint HexDigits_local;
  char *DST_local;
  DoubleAPFloat *this_local;
  
  local_24 = RM;
  local_1d = UpperCase;
  RM_local = HexDigits;
  pcStack_18 = DST;
  DST_local = (char *)this;
  if (this->Semantics != (fltSemantics *)semPPCDoubleDouble) {
    __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x10f8,
                  "unsigned int llvm::detail::DoubleAPFloat::convertToHexString(char *, unsigned int, bool, roundingMode) const"
                 );
  }
  bitcastToAPInt(&local_58);
  APFloat::APFloat(&local_48,(fltSemantics *)semPPCDoubleDoubleLegacy,(APInt *)&local_58);
  uVar1 = APFloat::convertToHexString(&local_48,pcStack_18,RM_local,(bool)(local_1d & 1),local_24);
  APFloat::~APFloat(&local_48);
  APInt::~APInt((APInt *)&local_58);
  return uVar1;
}

Assistant:

unsigned int DoubleAPFloat::convertToHexString(char *DST,
                                               unsigned int HexDigits,
                                               bool UpperCase,
                                               roundingMode RM) const {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  return APFloat(semPPCDoubleDoubleLegacy, bitcastToAPInt())
      .convertToHexString(DST, HexDigits, UpperCase, RM);
}